

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O3

void * bsp_create(int dimensions)

{
  undefined8 *puVar1;
  void *pvVar2;
  float *pfVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  int *piVar6;
  ulong uVar7;
  
  puVar1 = (undefined8 *)malloc(0x18);
  *(char *)(puVar1 + 1) = (char)dimensions;
  *(undefined1 *)((long)puVar1 + 9) = 0x40;
  *(undefined4 *)((long)puVar1 + 10) = 0x40;
  *(undefined2 *)((long)puVar1 + 0xe) = 0;
  pvVar2 = malloc((long)dimensions * 8 + 8);
  *puVar1 = pvVar2;
  if (0 < dimensions) {
    uVar7 = 0;
    do {
      pfVar3 = array_create_float(0x20);
      *(float **)((long)pvVar2 + uVar7 * 8) = pfVar3;
      uVar7 = uVar7 + 1;
    } while ((uint)dimensions != uVar7);
  }
  ppvVar4 = array_create_ptr(0x20);
  *(void ***)((long)pvVar2 + ((ulong)(uint)dimensions & 0xff) * 8) = ppvVar4;
  puVar5 = (undefined8 *)malloc(0x28);
  *puVar5 = puVar1;
  piVar6 = array_create_int(4);
  puVar5[1] = piVar6;
  *(undefined2 *)(puVar5 + 2) = 0xffff;
  *(undefined8 *)((long)puVar5 + 0x14) = 0;
  *(undefined8 *)((long)puVar5 + 0x1c) = 0;
  *(undefined4 *)((long)puVar5 + 0x24) = 0;
  puVar1[2] = puVar5;
  return puVar1;
}

Assistant:

void *
bsp_create(
    int dimensions )
{
    bsp_tree * tree;
    int i;

    assert( dimensions > 0 && dimensions < 128 );

    tree = (bsp_tree *)malloc( sizeof( bsp_tree ) );
    assert( tree != NULL );

    tree->dimensions = dimensions;
    tree->flags = 0;
    tree->maxdepth = 64;
    tree->maxnodepoints = 64;
    tree->mempoolid = 0;

    tree->pointarrays = (float **)malloc( sizeof(float *) * (dimensions + 1) );
    assert( tree->pointarrays != NULL );

    for ( i = 0; i < dimensions; i++ ) {
        tree->pointarrays[i] = array_create_float( 32 );
        assert( tree->pointarrays[i] != NULL );
    }
    tree->pointarrays[tree->dimensions] = (float *) array_create_ptr( 32 );
    assert( tree->pointarrays[tree->dimensions] != NULL );

    tree->top = _bsp_create_node( tree );
    return (void *) tree;
}